

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

char * __thiscall kj::Vector<char>::add<char>(Vector<char> *this,char *params)

{
  char *pcVar1;
  char *pcVar2;
  size_t newSize;
  
  pcVar2 = (this->builder).pos;
  if (pcVar2 == (this->builder).endPtr) {
    pcVar1 = (this->builder).ptr;
    newSize = 4;
    if (pcVar2 != pcVar1) {
      newSize = ((long)pcVar2 - (long)pcVar1) * 2;
    }
    setCapacity(this,newSize);
    pcVar2 = (this->builder).pos;
  }
  *pcVar2 = *params;
  pcVar2 = (this->builder).pos;
  (this->builder).pos = pcVar2 + 1;
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }